

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O0

int statemachine_parse(statemachine_ctx *ctx,char *str,int size)

{
  byte bVar1;
  int **ppiVar2;
  statemachine_definition *psVar3;
  size_t sVar4;
  statemachine_definition *def;
  int **state_table;
  int i;
  int size_local;
  char *str_local;
  statemachine_ctx *ctx_local;
  
  ppiVar2 = ctx->definition->transition_table;
  if (((ctx != (statemachine_ctx *)0x0) && (ctx->definition != (statemachine_definition *)0x0)) &&
     (ctx->definition->transition_table != (int **)0x0)) {
    if (size < 0) {
      snprintf(ctx->error_msg,0x50,"%s","Negative size in statemachine_parse().");
      ctx_local._4_4_ = 0x7f;
    }
    else {
      psVar3 = ctx->definition;
      _i = (byte *)str;
      for (state_table._0_4_ = 0; (int)state_table < size; state_table._0_4_ = (int)state_table + 1)
      {
        ctx->current_char = *_i;
        ctx->next_state = ppiVar2[ctx->current_state][*_i];
        if (ctx->next_state == 0x7f) {
          statemachine_set_transition_error_message(ctx);
          return 0x7f;
        }
        if ((ctx->current_state != ctx->next_state) &&
           (psVar3->exit_state_events[ctx->current_state] != (state_event_function)0x0)) {
          (*psVar3->exit_state_events[ctx->current_state])
                    (ctx,ctx->current_state,*_i,ctx->next_state);
        }
        if ((ctx->current_state != ctx->next_state) &&
           (psVar3->enter_state_events[ctx->next_state] != (state_event_function)0x0)) {
          (*psVar3->enter_state_events[ctx->next_state])(ctx,ctx->current_state,*_i,ctx->next_state)
          ;
        }
        if (psVar3->in_state_events[ctx->next_state] != (state_event_function)0x0) {
          (*psVar3->in_state_events[ctx->next_state])(ctx,ctx->current_state,*_i,ctx->next_state);
        }
        if ((ctx->recording != 0) && (ctx->record_pos < 0xff)) {
          bVar1 = *_i;
          sVar4 = ctx->record_pos;
          ctx->record_pos = sVar4 + 1;
          ctx->record_buffer[sVar4] = bVar1;
          ctx->record_buffer[ctx->record_pos] = '\0';
        }
        ctx->current_state = ctx->next_state;
        ctx->column_number = ctx->column_number + 1;
        if (*_i == 10) {
          ctx->line_number = ctx->line_number + 1;
          ctx->column_number = 1;
        }
        _i = _i + 1;
      }
      ctx_local._4_4_ = ctx->current_state;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx !=NULL && ctx->definition != NULL && ctx->definition->transition_table != NULL"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O0/src/tests/statemachine.c"
                ,0x188,"int statemachine_parse(statemachine_ctx *, const char *, int)");
}

Assistant:

int statemachine_parse(statemachine_ctx *ctx, const char *str, int size)
{
    int i;
    const int* const* state_table = ctx->definition->transition_table;
    statemachine_definition *def;

    assert(ctx !=NULL &&
           ctx->definition != NULL &&
           ctx->definition->transition_table != NULL);

    if (size < 0) {
        snprintf(ctx->error_msg, STATEMACHINE_MAX_STR_ERROR, "%s",
                 "Negative size in statemachine_parse().");
        return STATEMACHINE_ERROR;
    }

    def = ctx->definition;

    for (i = 0; i < size; i++) {
        ctx->current_char = *str;
        ctx->next_state =
            state_table[ctx->current_state][CAST(unsigned char, *str)];
        if (ctx->next_state == STATEMACHINE_ERROR) {
            statemachine_set_transition_error_message(ctx);
            return STATEMACHINE_ERROR;
        }

        if (ctx->current_state != ctx->next_state) {
            if (def->exit_state_events[ctx->current_state])
                def->exit_state_events[ctx->current_state](ctx,
                                                           ctx->current_state,
                                                           *str,
                                                           ctx->next_state);
        }
        if (ctx->current_state != ctx->next_state) {
            if (def->enter_state_events[ctx->next_state])
                def->enter_state_events[ctx->next_state](ctx,
                                                         ctx->current_state,
                                                         *str,
                                                         ctx->next_state);
        }

        if (def->in_state_events[ctx->next_state])
            def->in_state_events[ctx->next_state](ctx,
                                                  ctx->current_state,
                                                  *str,
                                                  ctx->next_state);

        /* We need two bytes left so we can NULL terminate the string. */
        if (ctx->recording &&
            STATEMACHINE_RECORD_BUFFER_SIZE - 1 > ctx->record_pos) {
            ctx->record_buffer[ctx->record_pos++] = *str;
            ctx->record_buffer[ctx->record_pos] = '\0';
        }

/* TODO(falmeida): Should clarify the contract here, since an event can change
 * ctx->next_state and we need this functionality */

        ctx->current_state = ctx->next_state;
        ctx->column_number++;

        if (*str == '\n') {
          ctx->line_number++;
          ctx->column_number = 1;
        }
        str++;
    }

    return ctx->current_state;
}